

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O1

pointer_type
cppcms::impl::
mfunc_to_io_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&,unsigned_long)>const&,std::pair<void*,unsigned_long>,booster::callback<void(std::error_code_const&,unsigned_long)>,std::pair<void*,unsigned_long>>
          (offset_in_fastcgi_to_subr f,shared_ptr<cppcms::impl::cgi::fastcgi> *s,
          callback<void_(const_std::error_code_&,_unsigned_long)> *p1,
          pair<void_*,_unsigned_long> *p2)

{
  io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
  *this;
  callback<void_(const_std::error_code_&,_unsigned_long)> *in_R8;
  pair<void_*,_unsigned_long> *in_R9;
  shared_ptr<cppcms::impl::cgi::fastcgi> *local_40;
  callback<void_(const_std::error_code_&,_unsigned_long)> *local_38;
  
  local_40 = s;
  local_38 = p1;
  this = (io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
          *)operator_new(0x48);
  io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
  ::io_handler_binder_p2
            (this,(offset_in_fastcgi_to_subr *)&local_40,
             (shared_ptr<cppcms::impl::cgi::fastcgi> *)p2,in_R8,in_R9);
  *(io_handler_binder_p2<void_(cppcms::impl::cgi::fastcgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&,_unsigned_long)>_&,_std::pair<void_*,_unsigned_long>),_std::shared_ptr<cppcms::impl::cgi::fastcgi>,_booster::callback<void_(const_std::error_code_&,_unsigned_long)>,_std::pair<void_*,_unsigned_long>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_(const_std::error_code_&,_unsigned_long)> *)f;
}

Assistant:

booster::aio::io_handler::pointer_type mfunc_to_io_handler(void (C::*f)(booster::system::error_code const &,size_t,P1,P2),S s,P1in const &p1,P2in const &p2)
{
	return new io_handler_binder_p2<void (C::*)(booster::system::error_code const &,size_t,P1,P2),S,P1in,P2in>(f,s,p1,p2);
}